

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

uint8_t __thiscall Spi::flash_read_status(Spi *this)

{
  char *pcVar1;
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  undefined2 local_12;
  Spi *pSStack_10;
  uint8_t data [2];
  Spi *this_local;
  
  local_12 = 5;
  pSStack_10 = this;
  flash_chip_select(this);
  xfer_spi(this,(uint8_t *)&local_12,2);
  flash_chip_deselect(this);
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"SR1: 0x%02X\n",(ulong)local_12._1_1_);
    pcVar1 = "locked";
    if (-1 < (short)local_12) {
      pcVar1 = "unlocked";
    }
    fprintf(_stdout," - SPRL: %s\n",pcVar1);
    pcVar1 = "Sequential Prog Mode";
    if ((local_12 & 0x4000) == 0) {
      pcVar1 = "Byte/Page Prog Mode";
    }
    fprintf(_stdout," -  SPM: %s\n",pcVar1);
    pcVar1 = "Erase/Prog error";
    if ((local_12 & 0x2000) == 0) {
      pcVar1 = "Erase/Prog success";
    }
    fprintf(_stdout," -  EPE: %s\n",pcVar1);
    pcVar1 = "~WP deasserted";
    if ((local_12 & 0x1000) == 0) {
      pcVar1 = "~WP asserted";
    }
    fprintf(_stdout,"-  SPM: %s\n",pcVar1);
    fprintf(_stdout," -  SWP: ");
    switch(local_12._1_1_ >> 2 & 3) {
    case 0:
      fprintf(_stdout,"All sectors unprotected\n");
      break;
    case 1:
      fprintf(_stdout,"Some sectors protected\n");
      break;
    case 2:
      fprintf(_stdout,"Reserved (xxxx 10xx)\n");
      break;
    case 3:
      fprintf(_stdout,"All sectors protected\n");
    }
    pcVar1 = "Write enabled";
    if ((local_12 & 0x200) == 0) {
      pcVar1 = "Not write enabled";
    }
    fprintf(_stdout," -  WEL: %s\n",pcVar1);
    pcVar1 = "Busy";
    if ((local_12 & 0x100) == 0) {
      pcVar1 = "Ready";
    }
    fprintf(_stdout," - ~RDY: %s\n",pcVar1);
  }
  local_24 = 1;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  return local_12._1_1_;
}

Assistant:

uint8_t Spi::flash_read_status() {
	uint8_t data[2] = { FC_RSR1 };

	flash_chip_select();
	xfer_spi(data, 2);
	flash_chip_deselect();

	if (verbose) {
		fprintf(stdout, "SR1: 0x%02X\n", data[1]);
		fprintf(stdout, " - SPRL: %s\n",
				((data[1] & (1 << 7)) == 0) ? "unlocked" : "locked");
		fprintf(stdout, " -  SPM: %s\n",
				((data[1] & (1 << 6)) == 0) ?
						"Byte/Page Prog Mode" : "Sequential Prog Mode");
		fprintf(stdout, " -  EPE: %s\n",
				((data[1] & (1 << 5)) == 0) ?
						"Erase/Prog success" : "Erase/Prog error");
		fprintf(stdout, "-  SPM: %s\n",
				((data[1] & (1 << 4)) == 0) ?
						"~WP asserted" : "~WP deasserted");
		fprintf(stdout, " -  SWP: ");
		switch ((data[1] >> 2) & 0x3) {
		case 0:
			fprintf(stdout, "All sectors unprotected\n");
			break;
		case 1:
			fprintf(stdout, "Some sectors protected\n");
			break;
		case 2:
			fprintf(stdout, "Reserved (xxxx 10xx)\n");
			break;
		case 3:
			fprintf(stdout, "All sectors protected\n");
			break;
		}
		fprintf(stdout, " -  WEL: %s\n",
				((data[1] & (1 << 1)) == 0) ?
						"Not write enabled" : "Write enabled");
		fprintf(stdout, " - ~RDY: %s\n",
				((data[1] & (1 << 0)) == 0) ? "Ready" : "Busy");
	}

	std::this_thread::sleep_for(std::chrono::milliseconds(1));
	return data[1];
}